

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ConditionalConstraintSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConditionalConstraintSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::ConstraintItemSyntax&,slang::syntax::ElseConstraintClauseSyntax*&>
          (BumpAllocator *this,Token *args,Token *args_1,ExpressionSyntax *args_2,Token *args_3,
          ConstraintItemSyntax *args_4,ElseConstraintClauseSyntax **args_5)

{
  Token ifKeyword;
  Token openParen;
  Token closeParen;
  ConditionalConstraintSyntax *this_00;
  
  this_00 = (ConditionalConstraintSyntax *)allocate(this,0x58,8);
  ifKeyword.kind = args->kind;
  ifKeyword._2_1_ = args->field_0x2;
  ifKeyword.numFlags.raw = (args->numFlags).raw;
  ifKeyword.rawLen = args->rawLen;
  ifKeyword.info = args->info;
  openParen.kind = args_1->kind;
  openParen._2_1_ = args_1->field_0x2;
  openParen.numFlags.raw = (args_1->numFlags).raw;
  openParen.rawLen = args_1->rawLen;
  openParen.info = args_1->info;
  closeParen.kind = args_3->kind;
  closeParen._2_1_ = args_3->field_0x2;
  closeParen.numFlags.raw = (args_3->numFlags).raw;
  closeParen.rawLen = args_3->rawLen;
  closeParen.info = args_3->info;
  slang::syntax::ConditionalConstraintSyntax::ConditionalConstraintSyntax
            (this_00,ifKeyword,openParen,args_2,closeParen,args_4,*args_5);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }